

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

uint argo::utf8::utf8_length(uint8_t c)

{
  undefined4 local_c;
  uint8_t c_local;
  
  if ((c & 0x80) == 0) {
    local_c = 1;
  }
  else if ((c & 0xe0) == 0xc0) {
    local_c = 2;
  }
  else if ((c & 0xf0) == 0xe0) {
    local_c = 3;
  }
  else if ((c & 0xf8) == 0xf0) {
    local_c = 4;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned int utf8::utf8_length(uint8_t c)
{
    if ((c & 0x80) == 0)
    {
        return 1;
    }
    else if ((c & 0xe0) == 0xc0)
    {
        return 2;
    }
    else if ((c & 0xf0) == 0xe0)
    {
        return 3;
    }
    else if ((c & 0xf8) == 0xf0)
    {
        return 4;
    }
    else
    {
       return 0;
    }
}